

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Ok> *
wasm::WATParser::ifelse<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool folded)

{
  Lexer *this;
  undefined1 *puVar1;
  undefined8 *puVar2;
  _Uninitialized<wasm::HeapType,_true> _Var3;
  bool bVar4;
  undefined7 in_register_00000009;
  _Alloc_hider _Var5;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  undefined1 local_1b0 [8];
  Result<wasm::HeapType> type;
  optional<wasm::Name> id1;
  optional<wasm::Name> label;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  optional<wasm::Name> id2;
  undefined1 local_58 [8];
  Result<wasm::HeapType> _val;
  
  this = &ctx->in;
  if ((int)CONCAT71(in_register_00000009,folded) == 0) {
    expected_00._M_str = "if";
    expected_00._M_len = 2;
    bVar4 = Lexer::takeKeyword(this,expected_00);
  }
  else {
    expected._M_str = "if";
    expected._M_len = 2;
    bVar4 = Lexer::takeSExprStart(this,expected);
  }
  if (bVar4 == false) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeID((optional<wasm::Name> *)
                &id1.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._M_engaged,this);
  blocktype<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::HeapType> *)local_1b0,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err> *)local_58,
             (_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err> *)local_1b0);
  if (_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ == '\x01') {
    puVar1 = (undefined1 *)
             ((long)&id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._M_payload + 8);
    local_78 = (undefined1  [8])puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_58,
               (undefined1 *)
               ((long)_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first.
                      _M_storage.id + (long)local_58));
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
    if (local_78 == (undefined1  [8])puVar1) {
      *puVar2 = CONCAT71(id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                         id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_78;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                    id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
    }
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)local_58);
    goto LAB_00bd9950;
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)local_58);
  if (folded) {
    foldedinstrs<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Ok> *)local_58,ctx);
    if (_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ != '\x01') {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ = 0;
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
      expected_02._M_str = "then";
      expected_02._M_len = 4;
      bVar4 = Lexer::takeSExprStart(this,expected_02);
      if (bVar4) goto LAB_00bd92fa;
      label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._16_8_ = &local_148;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged,
                 "expected \'then\' before if instructions","");
      Lexer::err((Err *)local_58,this,
                 (string *)
                 &label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
      _Var3._M_storage.id =
           (HeapType)
           ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                   super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 8);
      if ((HeapType)local_58 == _Var3._M_storage.id) {
        *puVar2 = CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                           _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
             _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
      }
      ((_Uninitialized<wasm::HeapType,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
           (HeapType)
           _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id;
      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id =
           (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      local_138.field_2._M_allocated_capacity = local_148._M_allocated_capacity;
      _Var5._M_p = (pointer)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._16_8_;
      local_58 = (undefined1  [8])_Var3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._16_8_ == &local_148) goto LAB_00bd9950;
      goto LAB_00bd9948;
    }
    local_78 = (undefined1  [8])
               ((long)&id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_payload + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_58,
               (undefined1 *)
               ((long)_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first.
                      _M_storage.id + (long)local_58));
LAB_00bd9328:
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
    if (local_78 ==
        (undefined1  [8])
        ((long)&id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_payload + 8)) {
      *puVar2 = CONCAT71(id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                         id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_78;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                    id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
    }
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
  }
  else {
    _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
    super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
    super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
    super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
    super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
    super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ = 0;
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
LAB_00bd92fa:
    instrs<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Ok> *)local_58,ctx);
    if (_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ == '\x01') {
      local_78 = (undefined1  [8])
                 ((long)&id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,local_58,
                 (undefined1 *)
                 ((long)_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first.
                        _M_storage.id + (long)local_58));
      goto LAB_00bd9328;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
    if (!folded) {
      expected_03._M_str = "else";
      expected_03._M_len = 4;
      bVar4 = Lexer::takeKeyword(this,expected_03);
      if (bVar4) {
LAB_00bd94ee:
        Lexer::takeID((optional<wasm::Name> *)
                      ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                              super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                              super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                              super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20),this);
        if ((id1.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01') &&
           ((label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\x01' ||
            (id1.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
             != label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                _M_len)))) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,"else label does not match if label","");
          Lexer::err((Err *)local_58,this,&local_118);
          puVar2 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
          _Var3._M_storage.id =
               (HeapType)
               ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 8);
          if ((HeapType)local_58 == _Var3._M_storage.id) {
            *puVar2 = CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                               _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                            super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                            _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                            super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
          }
          ((_Uninitialized<wasm::HeapType,_true> *)
          ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
               (HeapType)
               _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id;
          _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id =
               (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
          _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          local_138.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
          _Var5._M_p = local_118._M_dataplus._M_p;
          local_58 = (undefined1  [8])_Var3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p == &local_118.field_2) goto LAB_00bd9950;
        }
        else {
          _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ = 0;
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
          instrs<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Ok> *)local_58,ctx);
          if (_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
              super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
              super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
              super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
              super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
              super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ == '\x01') {
            local_78 = (undefined1  [8])
                       ((long)&id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::Name>._M_payload + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_78,local_58,
                       (undefined1 *)
                       ((long)_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                              super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                              super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                              super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                              super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first.
                              _M_storage.id + (long)local_58));
            goto LAB_00bd9328;
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
          if (!folded) goto LAB_00bd96e3;
          bVar4 = Lexer::takeRParen(this);
          if (bVar4) goto LAB_00bd93ab;
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f8,"expected \')\' at end of else block","");
          Lexer::err((Err *)local_58,this,&local_f8);
          puVar2 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
          _Var3._M_storage.id =
               (HeapType)
               ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 8);
          if ((HeapType)local_58 == _Var3._M_storage.id) {
            *puVar2 = CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                               _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                            super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                            _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                            super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
          }
          ((_Uninitialized<wasm::HeapType,_true> *)
          ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
               (HeapType)
               _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id;
          _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id =
               (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
          _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          local_138.field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
          _Var5._M_p = local_f8._M_dataplus._M_p;
          local_58 = (undefined1  [8])_Var3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_00bd9950;
        }
      }
      else {
LAB_00bd96e3:
        expected_04._M_str = "end";
        expected_04._M_len = 3;
        bVar4 = Lexer::takeKeyword(this,expected_04);
        if (bVar4) {
          Lexer::takeID((optional<wasm::Name> *)local_78,this);
          if ((id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\x01') ||
             ((label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01' &&
              (id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
               == label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                  _M_len)))) goto LAB_00bd9784;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"end label does not match if label","");
          Lexer::err((Err *)local_58,this,&local_98);
          puVar2 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
          _Var3._M_storage.id =
               (HeapType)
               ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 8);
          if ((HeapType)local_58 == _Var3._M_storage.id) {
            *puVar2 = CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                               _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                            super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                            _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                            super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
          }
          ((_Uninitialized<wasm::HeapType,_true> *)
          ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
               (HeapType)
               _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id;
          _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id =
               (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
          _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          local_138.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
          _Var5._M_p = local_98._M_dataplus._M_p;
          local_58 = (undefined1  [8])_Var3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_00bd9950;
        }
        else {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"expected \'end\' at end of if","");
          Lexer::err((Err *)local_58,this,&local_b8);
          puVar2 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
          _Var3._M_storage.id =
               (HeapType)
               ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 8);
          if ((HeapType)local_58 == _Var3._M_storage.id) {
            *puVar2 = CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                               _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                 super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                 super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                 super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                            super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                            _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                            super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                            super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
          }
          ((_Uninitialized<wasm::HeapType,_true> *)
          ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
               (HeapType)
               _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id;
          _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id =
               (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
          _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          local_138.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
          _Var5._M_p = local_b8._M_dataplus._M_p;
          local_58 = (undefined1  [8])_Var3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p == &local_b8.field_2) goto LAB_00bd9950;
        }
      }
LAB_00bd9948:
      local_58 = (undefined1  [8])
                 ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 8);
      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_ = 0;
      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id =
           (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
      operator_delete(_Var5._M_p,local_138.field_2._M_allocated_capacity + 1);
      goto LAB_00bd9950;
    }
    bVar4 = Lexer::takeRParen(this);
    if (!bVar4) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"expected \')\' at end of then block","");
      Lexer::err((Err *)local_58,this,&local_138);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
      _Var3._M_storage.id =
           (HeapType)
           ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                   super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 8);
      if ((HeapType)local_58 == _Var3._M_storage.id) {
        *puVar2 = CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                           _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
             _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
      }
      ((_Uninitialized<wasm::HeapType,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
           (HeapType)
           _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id;
      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id =
           (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      _Var5._M_p = local_138._M_dataplus._M_p;
      local_58 = (undefined1  [8])_Var3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_00bd9950;
      goto LAB_00bd9948;
    }
    expected_01._M_str = "else";
    expected_01._M_len = 4;
    bVar4 = Lexer::takeSExprStart(this,expected_01);
    if (bVar4) goto LAB_00bd94ee;
LAB_00bd93ab:
    bVar4 = Lexer::takeRParen(this);
    if (!bVar4) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"expected \')\' at end of if","");
      Lexer::err((Err *)local_58,this,&local_d8);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
      _Var3._M_storage.id =
           (HeapType)
           ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                   super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 8);
      if ((HeapType)local_58 == _Var3._M_storage.id) {
        *puVar2 = CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                           _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
             _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
      }
      ((_Uninitialized<wasm::HeapType,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
           (HeapType)
           _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id;
      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id =
           (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      local_138.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
      _Var5._M_p = local_d8._M_dataplus._M_p;
      local_58 = (undefined1  [8])_Var3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_00bd9950;
      goto LAB_00bd9948;
    }
LAB_00bd9784:
    _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
    super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
    super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
    super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
    super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
    super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
LAB_00bd9950:
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<>
ifelse(Ctx& ctx, const std::vector<Annotation>& annotations, bool folded) {
  auto pos = ctx.in.getPos();

  if ((folded && !ctx.in.takeSExprStart("if"sv)) ||
      (!folded && !ctx.in.takeKeyword("if"sv))) {
    return {};
  }

  auto label = ctx.in.takeID();

  auto type = blocktype(ctx);
  CHECK_ERR(type);

  if (folded) {
    CHECK_ERR(foldedinstrs(ctx));
    ctx.setSrcLoc(annotations);
  }

  CHECK_ERR(ctx.makeIf(pos, annotations, label, *type));

  if (folded && !ctx.in.takeSExprStart("then"sv)) {
    return ctx.in.err("expected 'then' before if instructions");
  }

  CHECK_ERR(instrs(ctx));

  if (folded && !ctx.in.takeRParen()) {
    return ctx.in.err("expected ')' at end of then block");
  }

  if ((folded && ctx.in.takeSExprStart("else"sv)) ||
      (!folded && ctx.in.takeKeyword("else"sv))) {
    auto id1 = ctx.in.takeID();
    if (id1 && id1 != label) {
      return ctx.in.err("else label does not match if label");
    }

    CHECK_ERR(ctx.visitElse());

    CHECK_ERR(instrs(ctx));

    if (folded && !ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of else block");
    }
  }

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of if");
    }
  } else {
    if (!ctx.in.takeKeyword("end"sv)) {
      return ctx.in.err("expected 'end' at end of if");
    }
    auto id2 = ctx.in.takeID();
    if (id2 && id2 != label) {
      return ctx.in.err("end label does not match if label");
    }
  }

  return ctx.visitEnd();
}